

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

CompilerGLSL * __thiscall
spirv_cross::CompilerGLSL::to_qualifiers_glsl_abi_cxx11_(CompilerGLSL *this,uint32_t id)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  CompilerError *this_00;
  uint32_t in_EDX;
  undefined4 in_register_00000034;
  CompilerGLSL *this_01;
  undefined1 local_e8 [40];
  string local_c0 [39];
  allocator local_99;
  string local_98 [39];
  byte local_71;
  SPIRType *pSStack_70;
  bool formatted_load;
  SPIRType *type;
  SPIRVariable *local_38;
  SPIRVariable *var;
  Bitset *local_28;
  Bitset *flags;
  CompilerGLSL *pCStack_18;
  uint32_t id_local;
  CompilerGLSL *this_local;
  string *res;
  
  this_01 = (CompilerGLSL *)CONCAT44(in_register_00000034,id);
  flags._4_4_ = in_EDX;
  pCStack_18 = this_01;
  this_local = this;
  TypedID<(spirv_cross::Types)0>::TypedID((TypedID<(spirv_cross::Types)0> *)((long)&var + 4),in_EDX)
  ;
  local_28 = Compiler::get_decoration_bitset((Compiler *)this_01,var._4_4_);
  var._3_1_ = 0;
  ::std::__cxx11::string::string((string *)this);
  local_38 = Compiler::maybe_get<spirv_cross::SPIRVariable>((Compiler *)this_01,flags._4_4_);
  if (((local_38 == (SPIRVariable *)0x0) || (local_38->storage != StorageClassWorkgroup)) ||
     (((this_01->backend).shared_is_implied & 1U) != 0)) {
    if ((local_38 != (SPIRVariable *)0x0) &&
       (local_38->storage == StorageClassTaskPayloadWorkgroupEXT)) {
      ::std::__cxx11::string::operator+=((string *)this,"taskPayloadSharedEXT ");
    }
  }
  else {
    ::std::__cxx11::string::operator+=((string *)this,"shared ");
  }
  (*(this_01->super_Compiler)._vptr_Compiler[0x32])(&type,this_01,local_28);
  ::std::__cxx11::string::operator+=((string *)this,(string *)&type);
  ::std::__cxx11::string::~string((string *)&type);
  if (local_38 != (SPIRVariable *)0x0) {
    iVar2 = (*(this_01->super_Compiler)._vptr_Compiler[0x30])(this_01,local_38);
    ::std::__cxx11::string::operator+=((string *)this,(char *)CONCAT44(extraout_var,iVar2));
  }
  pSStack_70 = Compiler::expression_type((Compiler *)this_01,flags._4_4_);
  if (((pSStack_70->image).dim != DimSubpassData) && ((pSStack_70->image).sampled == 2)) {
    bVar1 = Bitset::get(local_28,0x17);
    if (bVar1) {
      ::std::__cxx11::string::operator+=((string *)this,"coherent ");
    }
    bVar1 = Bitset::get(local_28,0x13);
    if (bVar1) {
      ::std::__cxx11::string::operator+=((string *)this,"restrict ");
    }
    bVar1 = Bitset::get(local_28,0x18);
    if (bVar1) {
      ::std::__cxx11::string::operator+=((string *)this,"readonly ");
    }
    local_71 = (pSStack_70->image).format == ImageFormatUnknown;
    bVar1 = Bitset::get(local_28,0x19);
    if (bVar1) {
      ::std::__cxx11::string::operator+=((string *)this,"writeonly ");
      local_71 = 0;
    }
    if ((local_71 & 1) != 0) {
      if (((this_01->options).es & 1U) != 0) {
        local_e8[0x26] = 1;
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_c0,"Cannot use GL_EXT_shader_image_load_formatted in ESSL.",
                   (allocator *)(local_e8 + 0x27));
        CompilerError::CompilerError(this_00,(string *)local_c0);
        local_e8[0x26] = 0;
        __cxa_throw(this_00,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_98,"GL_EXT_shader_image_load_formatted",&local_99);
      require_extension_internal(this_01,(string *)local_98);
      ::std::__cxx11::string::~string(local_98);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_99);
    }
  }
  to_precision_qualifiers_glsl_abi_cxx11_((CompilerGLSL *)local_e8,id);
  ::std::__cxx11::string::operator+=((string *)this,(string *)local_e8);
  ::std::__cxx11::string::~string((string *)local_e8);
  return this;
}

Assistant:

string CompilerGLSL::to_qualifiers_glsl(uint32_t id)
{
	auto &flags = get_decoration_bitset(id);
	string res;

	auto *var = maybe_get<SPIRVariable>(id);

	if (var && var->storage == StorageClassWorkgroup && !backend.shared_is_implied)
		res += "shared ";
	else if (var && var->storage == StorageClassTaskPayloadWorkgroupEXT)
		res += "taskPayloadSharedEXT ";

	res += to_interpolation_qualifiers(flags);
	if (var)
		res += to_storage_qualifiers_glsl(*var);

	auto &type = expression_type(id);
	if (type.image.dim != DimSubpassData && type.image.sampled == 2)
	{
		if (flags.get(DecorationCoherent))
			res += "coherent ";
		if (flags.get(DecorationRestrict))
			res += "restrict ";

		if (flags.get(DecorationNonWritable))
			res += "readonly ";

		bool formatted_load = type.image.format == ImageFormatUnknown;
		if (flags.get(DecorationNonReadable))
		{
			res += "writeonly ";
			formatted_load = false;
		}

		if (formatted_load)
		{
			if (!options.es)
				require_extension_internal("GL_EXT_shader_image_load_formatted");
			else
				SPIRV_CROSS_THROW("Cannot use GL_EXT_shader_image_load_formatted in ESSL.");
		}
	}

	res += to_precision_qualifiers_glsl(id);

	return res;
}